

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# length.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::ArrayOrListLengthBind
          (duckdb *this,ClientContext *context,ScalarFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  LogicalTypeId LVar1;
  int iVar2;
  reference pvVar3;
  pointer pEVar4;
  reference pvVar5;
  ParameterNotResolvedException *this_00;
  BinderException *this_01;
  code *__f;
  string local_48;
  
  pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar3);
  iVar2 = (*(pEVar4->super_BaseExpression)._vptr_BaseExpression[6])(pEVar4);
  if ((char)iVar2 == '\0') {
    pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
             ::operator[](arguments,0);
    pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(pvVar3);
    if ((pEVar4->return_type).id_ != UNKNOWN) {
      pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](arguments,0);
      pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar3);
      LVar1 = (pEVar4->return_type).id_;
      if (LVar1 == ARRAY) {
        __f = ArrayLengthFunction;
      }
      else {
        if (LVar1 != LIST) {
          this_01 = (BinderException *)__cxa_allocate_exception(0x10);
          local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_48,"length can only be used on arrays or lists","");
          BinderException::BinderException(this_01,&local_48);
          __cxa_throw(this_01,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        __f = ListLengthFunction;
      }
      ::std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::operator=
                ((function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)> *)
                 &bound_function->function,__f);
      pvVar3 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               ::operator[](arguments,0);
      pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(pvVar3);
      pvVar5 = vector<duckdb::LogicalType,_true>::operator[]
                         (&(bound_function->super_BaseScalarFunction).super_SimpleFunction.arguments
                          ,0);
      if (pvVar5 != &pEVar4->return_type) {
        pvVar5->id_ = (pEVar4->return_type).id_;
        pvVar5->physical_type_ = (pEVar4->return_type).physical_type_;
        shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                  (&pvVar5->type_info_,&(pEVar4->return_type).type_info_);
      }
      *(undefined8 *)this = 0;
      return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
             (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
    }
  }
  this_00 = (ParameterNotResolvedException *)__cxa_allocate_exception(0x10);
  ParameterNotResolvedException::ParameterNotResolvedException(this_00);
  __cxa_throw(this_00,&ParameterNotResolvedException::typeinfo,::std::runtime_error::~runtime_error)
  ;
}

Assistant:

static unique_ptr<FunctionData> ArrayOrListLengthBind(ClientContext &context, ScalarFunction &bound_function,
                                                      vector<unique_ptr<Expression>> &arguments) {
	if (arguments[0]->HasParameter() || arguments[0]->return_type.id() == LogicalTypeId::UNKNOWN) {
		throw ParameterNotResolvedException();
	}

	const auto &arg_type = arguments[0]->return_type.id();
	if (arg_type == LogicalTypeId::ARRAY) {
		bound_function.function = ArrayLengthFunction;
	} else if (arg_type == LogicalTypeId::LIST) {
		bound_function.function = ListLengthFunction;
	} else {
		// Unreachable
		throw BinderException("length can only be used on arrays or lists");
	}
	bound_function.arguments[0] = arguments[0]->return_type;
	return nullptr;
}